

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartitioningAroundMedoids.h
# Opt level: O1

DistanceType __thiscall
CPartitioningAroundMedois<CDissimilarityMatrix<float>_>::FindObjectDistanceToAll
          (CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this,size_t object)

{
  ulong uVar1;
  size_t anotherObject;
  ulong uVar2;
  float fVar3;
  
  uVar1 = this->matrix->size;
  if (object < uVar1) {
    fVar3 = 0.0;
    uVar2 = 0;
    do {
      fVar3 = fVar3 + (this->matrix->distances).super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start[object * uVar1 + uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    return fVar3;
  }
  __assert_fail("object < NumberOfObjects()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                ,0x4c,
                "typename CPartitioningAroundMedois<DMT>::DistanceType CPartitioningAroundMedois<CDissimilarityMatrix<float>>::FindObjectDistanceToAll(size_t) const [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
               );
}

Assistant:

typename CPartitioningAroundMedois<DMT>::DistanceType
CPartitioningAroundMedois<DMT>::FindObjectDistanceToAll( size_t object ) const
{
	assert( object < NumberOfObjects() );

	DistanceType distance = 0;
	for( size_t anotherObject = 0; anotherObject < NumberOfObjects(); anotherObject++ ) {
		distance += matrix.Distance( object, anotherObject );
	}

	return distance;
}